

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

ShaderProgram * __thiscall xe::ri::List::allocItem<xe::ri::ShaderProgram>(List *this)

{
  ShaderProgram *pSVar1;
  ShaderProgram *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pSVar1 = (ShaderProgram *)operator_new(0x60);
  (pSVar1->super_Item).m_type = TYPE_SHADERPROGRAM;
  (pSVar1->super_Item)._vptr_Item = (_func_int **)&PTR__ShaderProgram_0012e7c8;
  List(&pSVar1->shaders);
  pSVar1->linkStatus = false;
  (pSVar1->linkInfoLog).super_Item.m_type = TYPE_INFOLOG;
  (pSVar1->linkInfoLog).super_Item._vptr_Item = (_func_int **)&PTR__InfoLog_0012e800;
  (pSVar1->linkInfoLog).log._M_dataplus._M_p = (pointer)&(pSVar1->linkInfoLog).log.field_2;
  (pSVar1->linkInfoLog).log._M_string_length = 0;
  (pSVar1->linkInfoLog).log.field_2._M_local_buf[0] = '\0';
  local_18 = pSVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pSVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}